

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

void __thiscall libtorrent::aux::torrent::privileged_port_updated(torrent *this)

{
  bool bVar1;
  pointer this_00;
  alert_manager *paVar2;
  reason_t local_14c;
  undefined1 local_148 [24];
  basic_endpoint<boost::asio::ip::tcp> *ep;
  iterator __end3;
  iterator __begin3;
  vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
  *__range3;
  vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
  banned;
  torrent_state st;
  undefined1 local_40 [8];
  port_filter ports;
  torrent *this_local;
  
  ports.m_filter.m_access_list._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)this;
  bVar1 = ::std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr *)&(this->super_torrent_hot_members).m_peer_list);
  if (bVar1) {
    port_filter::port_filter((port_filter *)local_40);
    port_filter::add_rule((port_filter *)local_40,0,0x3ff,1);
    get_peer_list_state((torrent_state *)
                        &banned.
                         super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,this);
    ::std::
    vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
    ::vector((vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
              *)&__range3);
    this_00 = ::std::
              unique_ptr<libtorrent::aux::peer_list,_std::default_delete<libtorrent::aux::peer_list>_>
              ::operator->(&(this->super_torrent_hot_members).m_peer_list);
    peer_list::apply_port_filter
              (this_00,(port_filter *)local_40,
               (torrent_state *)
               &banned.
                super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
                *)&__range3);
    paVar2 = alerts(this);
    bVar1 = alert_manager::should_post<libtorrent::peer_blocked_alert>(paVar2);
    if (bVar1) {
      __end3 = ::std::
               vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
               ::begin((vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
                        *)&__range3);
      ep = (basic_endpoint<boost::asio::ip::tcp> *)
           ::std::
           vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
           ::end((vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
                  *)&__range3);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_*,_std::vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>_>
                                         *)&ep), bVar1) {
        local_148._16_8_ =
             __gnu_cxx::
             __normal_iterator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_*,_std::vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>_>
             ::operator*(&__end3);
        paVar2 = alerts(this);
        get_handle((torrent *)local_148);
        local_14c = privileged_ports;
        alert_manager::
        emplace_alert<libtorrent::peer_blocked_alert,libtorrent::torrent_handle,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>const&,libtorrent::peer_blocked_alert::reason_t>
                  (paVar2,(torrent_handle *)local_148,
                   (basic_endpoint<boost::asio::ip::tcp> *)local_148._16_8_,&local_14c);
        torrent_handle::~torrent_handle((torrent_handle *)local_148);
        __gnu_cxx::
        __normal_iterator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_*,_std::vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>_>
        ::operator++(&__end3);
      }
    }
    peers_erased(this,(vector<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                       *)&st.port);
    ::std::
    vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
    ::~vector((vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
               *)&__range3);
    torrent_state::~torrent_state
              ((torrent_state *)
               &banned.
                super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    port_filter::~port_filter((port_filter *)local_40);
  }
  return;
}

Assistant:

void torrent::privileged_port_updated()
	{
		if (!m_peer_list) return;

		port_filter ports;
		ports.add_rule(0, 1023, port_filter::blocked);

		torrent_state st = get_peer_list_state();
		std::vector<tcp::endpoint> banned;
		m_peer_list->apply_port_filter(ports, &st, banned);

		if (alerts().should_post<peer_blocked_alert>())
		{
			for (auto const& ep : banned)
				alerts().emplace_alert<peer_blocked_alert>(get_handle()
					, ep, peer_blocked_alert::privileged_ports);
		}

		peers_erased(st.erased);
	}